

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall r_comp::Compiler::Compiler(Compiler *this,Image *_image,Metadata *_metadata)

{
  (this->error)._M_dataplus._M_p = (pointer)&(this->error).field_2;
  (this->error)._M_string_length = 0;
  (this->error).field_2._M_local_buf[0] = '\0';
  (this->m_errorFile)._M_dataplus._M_p = (pointer)&(this->m_errorFile).field_2;
  (this->m_errorFile)._M_string_length = 0;
  (this->m_errorFile).field_2._M_local_buf[0] = '\0';
  Class::Class(&this->current_class,ANY);
  this->current_object = (ImageObject *)0x0;
  (this->state).pattern_lvl = 0;
  (this->state).no_arity_check = false;
  (this->local_references)._M_h._M_buckets = &(this->local_references)._M_h._M_single_bucket;
  (this->local_references)._M_h._M_bucket_count = 1;
  (this->local_references)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->local_references)._M_h._M_element_count = 0;
  (this->local_references)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->local_references)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->local_references)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->hlp_references).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hlp_references).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hlp_references).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_image = _image;
  this->_metadata = _metadata;
  return;
}

Assistant:

Compiler::Compiler(Image *_image, Metadata *_metadata)
{
    this->_image = _image;
    this->_metadata = _metadata;
}